

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Tag::Write(Tag *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  uint64_t uVar6;
  undefined4 extraout_var_00;
  long lVar7;
  uint64 value;
  long lVar8;
  
  if (this->simple_tags_count_ < 1) {
    value = 0;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    value = 0;
    do {
      uVar4 = SimpleTag::Write((SimpleTag *)((long)&this->simple_tags_->tag_name_ + lVar8),
                               (IMkvWriter *)0x0);
      value = value + uVar4;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < this->simple_tags_count_);
  }
  uVar5 = EbmlMasterElementSize(0x7373,value);
  uVar4 = uVar5 + value;
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = WriteEbmlMasterElement(writer,0x7373,value);
    if (bVar1) {
      if (0 < this->simple_tags_count_) {
        lVar8 = 0;
        lVar7 = 0;
        do {
          uVar6 = SimpleTag::Write((SimpleTag *)((long)&this->simple_tags_->tag_name_ + lVar8),
                                   writer);
          if (uVar6 == 0) goto LAB_0011b829;
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar7 < this->simple_tags_count_);
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      uVar6 = 0;
      if (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar4) {
        uVar6 = uVar4;
      }
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        uVar4 = uVar6;
      }
    }
    else {
LAB_0011b829:
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

uint64_t Tag::Write(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];
    payload_size += st.Write(NULL);
  }

  const uint64_t tag_size =
      EbmlMasterElementSize(libwebm::kMkvTag, payload_size) + payload_size;

  if (writer == NULL)
    return tag_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTag, payload_size))
    return 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];

    if (!st.Write(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != tag_size)
    return 0;

  return tag_size;
}